

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

void __thiscall QHexView::copyAs(QHexView *this,CopyMode mode)

{
  char cVar1;
  QHexDocument *pQVar2;
  bool bVar3;
  undefined8 uVar4;
  void *__buf;
  long lVar5;
  qsizetype qVar6;
  char *pcVar7;
  char *local_270;
  QLatin1Char local_22b;
  QChar local_22a;
  QString local_228;
  QString local_210;
  QString local_1f8;
  uint local_1dc;
  undefined1 local_1d8 [4];
  int i_1;
  QString hexchar_2;
  QString local_1b8;
  QString local_1a0;
  QString local_188;
  QString local_170;
  QString local_158;
  char local_139;
  iterator pcStack_138;
  char b_1;
  iterator __end2_1;
  iterator __begin2_1;
  QByteArray *__range2_1;
  QString hexchar_1;
  QString local_100;
  QString local_e8;
  QString local_d0;
  QString local_b8;
  QString local_a0;
  char local_81;
  iterator pcStack_80;
  char b;
  iterator __end2;
  iterator local_68;
  iterator __begin2;
  QByteArray *__range2;
  undefined1 local_50 [4];
  int i;
  QString hexchar;
  QByteArray bytes;
  QClipboard *c;
  CopyMode mode_local;
  QHexView *this_local;
  
  QCoreApplication::instance();
  uVar4 = QGuiApplication::clipboard();
  bVar3 = QHexCursor::hasSelection(this->m_hexcursor);
  if (bVar3) {
    QHexCursor::selectedBytes((QByteArray *)&hexchar.d.size,this->m_hexcursor);
  }
  else {
    pQVar2 = this->m_hexdocument;
    __buf = (void *)QHexCursor::offset(this->m_hexcursor);
    QHexDocument::read((QHexDocument *)&hexchar.d.size,(int)pQVar2,__buf,1);
  }
  if (mode - HexArraySquare < 2) {
    QString::QString((QString *)local_50);
    __range2._4_4_ = 0;
    __begin2 = (iterator)&hexchar.d.size;
    local_68 = QByteArray::begin((QByteArray *)__begin2);
    pcStack_80 = QByteArray::end((QByteArray *)__begin2);
    for (; local_68 != pcStack_80; local_68 = local_68 + 1) {
      local_81 = *local_68;
      bVar3 = QString::isEmpty((QString *)local_50);
      if (((!bVar3) &&
          (QString::operator+=((QString *)local_50,", "), ((this->m_options).copybreak & 1U) != 0))
         && (__range2._4_4_ = __range2._4_4_ + 1, __range2._4_4_ % (this->m_options).linelength == 0
            )) {
        QString::operator+=((QString *)local_50,"\n");
      }
      QString::number((uint)&local_d0,(int)local_81);
      QString::toUpper(&local_b8,&local_d0);
      ::operator+(&local_a0,"0x",&local_b8);
      QString::operator+=((QString *)local_50,&local_a0);
      QString::~QString(&local_a0);
      QString::~QString(&local_b8);
      QString::~QString(&local_d0);
    }
    if (mode == HexArraySquare) {
      local_270 = "[%1]";
    }
    else {
      local_270 = "{%1}";
    }
    QString::QString(&local_100,local_270);
    QLatin1Char::QLatin1Char((QLatin1Char *)((long)&hexchar_1.d.size + 5),' ');
    QChar::QChar((QChar *)((long)&hexchar_1.d.size + 6),hexchar_1.d.size._5_1_);
    QString::arg((QString *)&local_e8,(int)&local_100,(QChar)(char16_t)local_50);
    QClipboard::setText(uVar4,&local_e8,0);
    QString::~QString(&local_e8);
    QString::~QString(&local_100);
    QString::~QString((QString *)local_50);
  }
  else if (mode == HexArrayChar) {
    QString::QString((QString *)&__range2_1);
    __begin2_1 = (iterator)&hexchar.d.size;
    __end2_1 = QByteArray::begin((QByteArray *)__begin2_1);
    pcStack_138 = QByteArray::end((QByteArray *)__begin2_1);
    for (; __end2_1 != pcStack_138; __end2_1 = __end2_1 + 1) {
      local_139 = *__end2_1;
      QString::number((uint)&local_188,(int)local_139);
      QString::toUpper(&local_170,&local_188);
      ::operator+(&local_158,"\\x",&local_170);
      QString::operator+=((QString *)&__range2_1,&local_158);
      QString::~QString(&local_158);
      QString::~QString(&local_170);
      QString::~QString(&local_188);
    }
    QString::QString(&local_1b8,"\"%1\"");
    QLatin1Char::QLatin1Char((QLatin1Char *)((long)&hexchar_2.d.size + 5),' ');
    QChar::QChar((QChar *)((long)&hexchar_2.d.size + 6),hexchar_2.d.size._5_1_);
    QString::arg((QString *)&local_1a0,(int)&local_1b8,(QChar)(char16_t)&__range2_1);
    QClipboard::setText(uVar4,&local_1a0,0);
    QString::~QString(&local_1a0);
    QString::~QString(&local_1b8);
    QString::~QString((QString *)&__range2_1);
  }
  else {
    QString::QString((QString *)local_1d8);
    for (local_1dc = 0; lVar5 = (long)(int)local_1dc,
        qVar6 = QByteArray::size((QByteArray *)&hexchar.d.size), lVar5 < qVar6;
        local_1dc = local_1dc + 1) {
      if (local_1dc % (this->m_options).grouplength == 0) {
        bVar3 = QString::isEmpty((QString *)local_1d8);
        if (((!bVar3) &&
            (QString::operator+=((QString *)local_1d8,", "), ((this->m_options).copybreak & 1U) != 0
            )) && (local_1dc % (this->m_options).linelength == 0)) {
          QString::operator+=((QString *)local_1d8,"\n");
        }
        QString::operator+=((QString *)local_1d8,"0x");
      }
      QString::QString(&local_228,"%1");
      pcVar7 = QByteArray::operator[]((QByteArray *)&hexchar.d.size,(long)(int)local_1dc);
      cVar1 = *pcVar7;
      QLatin1Char::QLatin1Char(&local_22b,'0');
      QChar::QChar(&local_22a,local_22b);
      QString::arg(&local_210,&local_228,(int)cVar1,2,0x10,local_22a);
      QString::toUpper(&local_1f8,&local_210);
      QString::operator+=((QString *)local_1d8,&local_1f8);
      QString::~QString(&local_1f8);
      QString::~QString(&local_210);
      QString::~QString(&local_228);
    }
    QClipboard::setText(uVar4,local_1d8,0);
    QString::~QString((QString *)local_1d8);
  }
  QByteArray::~QByteArray((QByteArray *)&hexchar.d.size);
  return;
}

Assistant:

void QHexView::copyAs(CopyMode mode) const {
    QClipboard* c = qApp->clipboard();

    QByteArray bytes = m_hexcursor->hasSelection()
                           ? m_hexcursor->selectedBytes()
                           : m_hexdocument->read(m_hexcursor->offset(), 1);

    switch(mode) {
        case CopyMode::HexArrayCurly:
        case CopyMode::HexArraySquare: {
            QString hexchar;
            int i = 0;

            for(char b : bytes) {
                if(!hexchar.isEmpty()) {
                    hexchar += ", ";
                    if(m_options.copybreak && !(++i % m_options.linelength))
                        hexchar += "\n";
                }

                hexchar +=
                    "0x" + QString::number(static_cast<uint>(b), 16).toUpper();
            }

            c->setText(
                QString(mode == CopyMode::HexArraySquare ? "[%1]" : "{%1}")
                    .arg(hexchar));
            break;
        }

        case CopyMode::HexArrayChar: {
            QString hexchar;

            for(char b : bytes)
                hexchar +=
                    "\\x" + QString::number(static_cast<uint>(b), 16).toUpper();

            c->setText(QString("\"%1\"").arg(hexchar));
            break;
        }

        default: {
            QString hexchar;

            for(int i = 0; i < bytes.size(); i++) {
                if(!(i % m_options.grouplength)) {
                    if(!hexchar.isEmpty()) {
                        hexchar += ", ";
                        if(m_options.copybreak && !(i % m_options.linelength))
                            hexchar += "\n";
                    }

                    hexchar += "0x";
                }

                hexchar += QString("%1")
                               .arg(static_cast<uint>(bytes[i]), 2, 16,
                                    QLatin1Char('0'))
                               .toUpper();
            }

            c->setText(hexchar);
            break;
        }
    }
}